

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O1

uint32_t __thiscall
icu_63::FCDUTF16CollationIterator::handleNextCE32
          (FCDUTF16CollationIterator *this,UChar32 *c,UErrorCode *errorCode)

{
  UChar *pUVar1;
  UChar **ppUVar2;
  UChar UVar3;
  UChar *pUVar4;
  UTrie2 *pUVar5;
  char cVar6;
  UBool UVar7;
  uint32_t uVar8;
  UChar *pUVar9;
  
  cVar6 = this->checkDir;
  while (cVar6 < '\x01') {
    if ((cVar6 == '\0') &&
       (pUVar9 = (this->super_UTF16CollationIterator).pos,
       pUVar9 != (this->super_UTF16CollationIterator).limit)) goto LAB_0024ddff;
    switchToForward(this);
    cVar6 = this->checkDir;
  }
  pUVar9 = (this->super_UTF16CollationIterator).pos;
  pUVar4 = (this->super_UTF16CollationIterator).limit;
  if (pUVar9 == pUVar4) {
LAB_0024ddeb:
    *c = -1;
    uVar8 = 0xc0;
  }
  else {
    ppUVar2 = &(this->super_UTF16CollationIterator).pos;
    pUVar1 = pUVar9 + 1;
    *ppUVar2 = pUVar1;
    UVar3 = *pUVar9;
    *c = (uint)(ushort)UVar3;
    if (0xbf < (ushort)UVar3) {
      if ((((ulong)(byte)CollationFCD::tcccIndex[(ushort)UVar3 >> 5] != 0) &&
          ((*(uint *)(CollationFCD::tcccBits +
                     (ulong)(byte)CollationFCD::tcccIndex[(ushort)UVar3 >> 5] * 4) >>
            ((ushort)UVar3 & 0x1f) & 1) != 0)) &&
         ((((ushort)UVar3 & 0xff01) == 0xf01 ||
          ((((pUVar1 != pUVar4 && (UVar3 = *pUVar1, 0x2ff < (ushort)UVar3)) &&
            ((ulong)(byte)CollationFCD::lcccIndex[(ushort)UVar3 >> 5] != 0)) &&
           ((*(uint *)(CollationFCD::lcccBits +
                      (ulong)(byte)CollationFCD::lcccIndex[(ushort)UVar3 >> 5] * 4) >>
             ((ushort)UVar3 & 0x1f) & 1) != 0)))))) {
        (this->super_UTF16CollationIterator).pos = pUVar9;
        UVar7 = nextSegment(this,errorCode);
        if (UVar7 == '\0') goto LAB_0024ddeb;
        pUVar9 = *ppUVar2;
LAB_0024ddff:
        (this->super_UTF16CollationIterator).pos = pUVar9 + 1;
        *c = (uint)(ushort)*pUVar9;
      }
    }
    pUVar5 = (this->super_UTF16CollationIterator).super_CollationIterator.trie;
    uVar8 = pUVar5->data32[(*c & 0x1fU) + (uint)pUVar5->index[*c >> 5] * 4];
  }
  return uVar8;
}

Assistant:

uint32_t
FCDUTF16CollationIterator::handleNextCE32(UChar32 &c, UErrorCode &errorCode) {
    for(;;) {
        if(checkDir > 0) {
            if(pos == limit) {
                c = U_SENTINEL;
                return Collation::FALLBACK_CE32;
            }
            c = *pos++;
            if(CollationFCD::hasTccc(c)) {
                if(CollationFCD::maybeTibetanCompositeVowel(c) ||
                        (pos != limit && CollationFCD::hasLccc(*pos))) {
                    --pos;
                    if(!nextSegment(errorCode)) {
                        c = U_SENTINEL;
                        return Collation::FALLBACK_CE32;
                    }
                    c = *pos++;
                }
            }
            break;
        } else if(checkDir == 0 && pos != limit) {
            c = *pos++;
            break;
        } else {
            switchToForward();
        }
    }
    return UTRIE2_GET32_FROM_U16_SINGLE_LEAD(trie, c);
}